

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

VOID CorUnix::PROCRemoveThread(CPalThread *pCurrentThread,CPalThread *pTargetThread)

{
  CPalThread *pNext;
  CPalThread *local_28;
  CPalThread *prevThread;
  CPalThread *curThread;
  CPalThread *pTargetThread_local;
  CPalThread *pCurrentThread_local;
  
  InternalEnterCriticalSection(pCurrentThread,&g_csProcess);
  if (pGThreadList == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PROCRemoveThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x78e);
    fprintf(_stderr,"Thread list is empty.\n");
  }
  else if (pGThreadList == pTargetThread) {
    pGThreadList = CPalThread::GetNext(pGThreadList);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CPalThread::GetThreadId(pTargetThread);
  }
  else {
    local_28 = pGThreadList;
    for (prevThread = CPalThread::GetNext(pGThreadList); prevThread != (CPalThread *)0x0;
        prevThread = CPalThread::GetNext(prevThread)) {
      if (prevThread == pTargetThread) {
        pNext = CPalThread::GetNext(prevThread);
        CPalThread::SetNext(local_28,pNext);
        g_dwThreadCount = g_dwThreadCount - 1;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        goto LAB_003ce8f2;
      }
      local_28 = prevThread;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
LAB_003ce8f2:
  InternalLeaveCriticalSection(pCurrentThread,&g_csProcess);
  return;
}

Assistant:

VOID
CorUnix::PROCRemoveThread(
    CPalThread *pCurrentThread,
    CPalThread *pTargetThread
    )
{
    CPalThread *curThread, *prevThread;

    /* protect the access of the thread list with critical section for
       mutithreading access */
    InternalEnterCriticalSection(pCurrentThread, &g_csProcess);

    curThread = pGThreadList;

    /* if thread list is empty */
    if (curThread == NULL)
    {
        ASSERT("Thread list is empty.\n");
        goto EXIT;
    }

    /* do we remove the first thread? */
    if (curThread == pTargetThread)
    {
        pGThreadList =  curThread->GetNext();
        TRACE("Thread 0x%p (id %#x) removed from the process thread list\n",
            pTargetThread, pTargetThread->GetThreadId());
        goto EXIT;
    }

    prevThread = curThread;
    curThread = curThread->GetNext();
    /* find the thread to remove */
    while (curThread != NULL)
    {
        if (curThread == pTargetThread)
        {
            /* found, fix the chain list */
            prevThread->SetNext(curThread->GetNext());
            g_dwThreadCount -= 1;
            TRACE("Thread %p removed from the process thread list\n", pTargetThread);
            goto EXIT;
        }

        prevThread = curThread;
        curThread = curThread->GetNext();
    }

    WARN("Thread %p not removed (it wasn't found in the list)\n", pTargetThread);

EXIT:
    InternalLeaveCriticalSection(pCurrentThread, &g_csProcess);
}